

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpecificStrategy.cpp
# Opt level: O2

Report * __thiscall
SpecificStrategy::compareCFGs(Report *__return_storage_ptr__,SpecificStrategy *this,CFG *a,CFG *b)

{
  Info *__return_storage_ptr___00;
  Info *this_00;
  
  extractInfo(&__return_storage_ptr__->present,this,a);
  __return_storage_ptr___00 = &__return_storage_ptr__->missing;
  this_00 = __return_storage_ptr___00;
  extractInfo(__return_storage_ptr___00,this,b);
  matchAddresses((SpecificStrategy *)this_00,
                 (set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
                 __return_storage_ptr__,&__return_storage_ptr___00->instrs);
  matchBlocks((SpecificStrategy *)this_00,&(__return_storage_ptr__->present).blocks,
              &(__return_storage_ptr__->missing).blocks);
  matchAddresses((SpecificStrategy *)this_00,&(__return_storage_ptr__->present).phantoms,
                 &(__return_storage_ptr__->missing).phantoms);
  matchEdges((SpecificStrategy *)this_00,&(__return_storage_ptr__->present).edges,
             &(__return_storage_ptr__->missing).edges);
  matchCalls((SpecificStrategy *)this_00,&(__return_storage_ptr__->present).calls,
             &(__return_storage_ptr__->missing).calls);
  matchAddresses((SpecificStrategy *)this_00,&(__return_storage_ptr__->present).indirects,
                 &(__return_storage_ptr__->missing).indirects);
  return __return_storage_ptr__;
}

Assistant:

SpecificStrategy::Report SpecificStrategy::compareCFGs(CFG* a, CFG* b) {
	SpecificStrategy::Report r = { .present = this->extractInfo(a),
			.missing = this->extractInfo(b) };

	this->matchAddresses(r.present.instrs, r.missing.instrs);
	this->matchBlocks(r.present.blocks, r.missing.blocks);
	this->matchAddresses(r.present.phantoms, r.missing.phantoms);
	this->matchEdges(r.present.edges, r.missing.edges);
	this->matchCalls(r.present.calls, r.missing.calls);
	this->matchAddresses(r.present.indirects, r.missing.indirects);

	return r;
}